

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::InnerMap::clear(InnerMap *this)

{
  bool bVar1;
  LogMessage *other;
  Node *node_00;
  _Self local_b8;
  _Base_ptr local_b0;
  Node *local_a8;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>
  local_a0;
  iterator next_1;
  Node *node_1;
  iterator tree_it;
  LogMessage local_68;
  map<std::reference_wrapper<std::__cxx11::string_const>,void*,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
  *local_30;
  Tree *tree;
  Node *next;
  Node *node;
  size_type b;
  InnerMap *this_local;
  
  b = (size_type)this;
  for (node = (Node *)0x0; node < (Node *)this->num_buckets_; node = (Node *)&node->field_0x1) {
    bVar1 = TableEntryIsNonEmptyList(this,(size_type)node);
    if (bVar1) {
      next = (Node *)this->table_[(long)node];
      this->table_[(long)node] = (void *)0x0;
      do {
        tree = (Tree *)next->next;
        DestroyNode(this,next);
        next = (Node *)tree;
      } while (tree != (Tree *)0x0);
    }
    else {
      bVar1 = TableEntryIsTree(this,(size_type)node);
      if (bVar1) {
        local_30 = (map<std::reference_wrapper<std::__cxx11::string_const>,void*,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                    *)this->table_[(long)node];
        bVar1 = false;
        if ((this->table_[(long)node] != this->table_[(long)&node->field_0x1]) ||
           (((ulong)node & 1) != 0)) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x28f);
          bVar1 = true;
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ")
          ;
          internal::LogFinisher::operator=((LogFinisher *)((long)&tree_it._M_node + 3),other);
        }
        if (bVar1) {
          internal::LogMessage::~LogMessage(&local_68);
        }
        this->table_[(long)&node->field_0x1] = (void *)0x0;
        this->table_[(long)node] = (void *)0x0;
        node_1 = (Node *)std::
                         map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
                         ::begin((map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
                                  *)local_30);
        do {
          next_1._M_node = (_Base_ptr)node_1;
          node_00 = NodeFromTreeIterator((TreeIterator)node_1);
          local_a0._M_node = (_Base_ptr)node_1;
          std::
          _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>
          ::operator++(&local_a0);
          local_a8 = node_1;
          local_b0 = (_Base_ptr)
                     std::
                     map<std::reference_wrapper<std::__cxx11::string_const>,void*,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                     ::erase_abi_cxx11_(local_30,(iterator)node_1);
          DestroyNode(this,node_00);
          node_1 = (Node *)local_a0._M_node;
          local_b8._M_node =
               (_Base_ptr)
               std::
               map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
               ::end((map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
                      *)local_30);
          bVar1 = std::operator!=((_Self *)&node_1,&local_b8);
        } while (bVar1);
        DestroyTree(this,(Tree *)local_30);
        node = (Node *)&node->field_0x1;
      }
    }
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = this->num_buckets_;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = nullptr;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != nullptr);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = nullptr;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodeFromTreeIterator(tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }